

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

NDeviceChannel * __thiscall
NDevice::getChannel(NDeviceChannel *__return_storage_ptr__,NDevice *this,int index)

{
  pointer pNVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  
  pNVar1 = (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (index < (int)((ulong)((long)(this->channels).
                                  super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 6))
  {
    (__return_storage_ptr__->super_NetworkDataType)._vptr_NetworkDataType =
         (_func_int **)&PTR__NDeviceChannel_002e7550;
    (__return_storage_ptr__->id)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->id).field_2;
    pcVar2 = pNVar1[index].id._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->id,pcVar2,
               pcVar2 + pNVar1[index].id._M_string_length);
    __return_storage_ptr__->interleavedDataBit = pNVar1[index].interleavedDataBit;
    pNVar1 = pNVar1 + index;
    iVar4 = pNVar1->startBit;
    uVar3 = *(undefined8 *)(&pNVar1->startByte + 2);
    __return_storage_ptr__->startByte = pNVar1->startByte;
    __return_storage_ptr__->startBit = iVar4;
    *(undefined8 *)&__return_storage_ptr__->type = uVar3;
  }
  else {
    NDeviceChannel::NDeviceChannel(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

NDeviceChannel NDevice::getChannel(int index) const{
    if (index >= (int)channels.size()) {
        return NDeviceChannel();
    }
    return channels[index];
}